

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

TType * __thiscall glslang::TAnonMember::getWritableType(TAnonMember *this)

{
  int iVar1;
  undefined4 extraout_var;
  TTypeList *pTVar2;
  
  if ((this->super_TSymbol).writable != false) {
    iVar1 = (*(this->anonContainer->super_TSymbol)._vptr_TSymbol[0xc])();
    pTVar2 = TType::getStruct((TType *)CONCAT44(extraout_var,iVar1));
    return (pTVar2->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_start[this->memberNumber].type;
  }
  __assert_fail("writable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                ,0x181,"virtual TType &glslang::TAnonMember::getWritableType()");
}

Assistant:

virtual TType& getWritableType() override
    {
        assert(writable);
        const TTypeList& types = *anonContainer.getType().getStruct();
        return *types[memberNumber].type;
    }